

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

const_iterator pstore::command_line::option::add_to_global_list(option *opt)

{
  iterator __x;
  iterator local_28;
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_> *local_20;
  options_container *all;
  option *opt_local;
  
  all = (options_container *)opt;
  local_20 = all_abi_cxx11_();
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::push_back
            (local_20,(value_type *)&all);
  __x = std::__cxx11::
        list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::end
                  (local_20);
  local_28._M_node =
       (_List_node_base *)
       std::prev<std::_List_iterator<pstore::command_line::option*>>(__x._M_node,1);
  std::_List_const_iterator<pstore::command_line::option_*>::_List_const_iterator
            ((_List_const_iterator<pstore::command_line::option_*> *)&opt_local,&local_28);
  return (const_iterator)(_List_node_base *)opt_local;
}

Assistant:

auto option::add_to_global_list (option * const opt)
                -> options_container::const_iterator {
                options_container & all = option::all ();
                all.push_back (opt);
                return std::prev (all.end ());
            }